

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  byte bVar1;
  EnumDescriptor *pEVar2;
  Descriptor *pDVar3;
  char *pcVar4;
  undefined8 local_70;
  char *local_68;
  AlphaNum local_40;
  
  bVar1 = this->type_;
  if (bVar1 - 10 < 2) {
    if ((bVar1 != 10) || (999 < (int)this->file_->edition_)) {
      local_70 = 1;
      local_68 = ".";
      pDVar3 = message_type(this);
      pcVar4 = (pDVar3->all_names_).payload_;
LAB_00395582:
      local_40.piece_._M_len = (size_t)*(ushort *)(pcVar4 + 2);
      local_40.piece_._M_str = pcVar4 + ~local_40.piece_._M_len;
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_70,&local_40,
                 (AlphaNum *)local_40.piece_._M_str);
      return __return_storage_ptr__;
    }
    pcVar4 = "group";
  }
  else {
    if (bVar1 == 0xe) {
      local_70 = 1;
      local_68 = ".";
      pEVar2 = enum_type(this);
      pcVar4 = (pEVar2->all_names_).payload_;
      goto LAB_00395582;
    }
    pcVar4 = *(char **)(kTypeToName + (ulong)bVar1 * 8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
    case TYPE_GROUP:
      if (IsGroupSyntax(file()->edition(), this)) {
        return kTypeToName[type()];
      }
      return absl::StrCat(".", message_type()->full_name());
    case TYPE_ENUM:
      return absl::StrCat(".", enum_type()->full_name());
    default:
      return kTypeToName[type()];
  }
}